

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup.cpp
# Opt level: O0

void SetupCMD(CmdLine *cmd)

{
  CmdLine *in_stack_00000340;
  string local_a0 [32];
  string local_80 [16];
  String *in_stack_ffffffffffffff90;
  String *in_stack_ffffffffffffff98;
  string local_60 [6];
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  char (*in_stack_ffffffffffffffa8) [4];
  API<Args::CmdLine,_Args::CmdLine,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_true>
  *in_stack_ffffffffffffffb0;
  String *in_stack_ffffffffffffffc0;
  String *in_stack_ffffffffffffffc8;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"bar",&local_29);
  std::__cxx11::string::string(local_60);
  std::__cxx11::string::string(local_80);
  std::__cxx11::string::string(local_a0);
  Args::details::
  API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
  ::addArgWithNameOnly<char_const(&)[4]>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(bool)in_stack_ffffffffffffffa7,
             (bool)in_stack_ffffffffffffffa6,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  Args::CmdLine::parse(in_stack_00000340);
  return;
}

Assistant:

void SetupCMD( Args::CmdLine & cmd )
{
	cmd.addArgWithNameOnly( "foo", true, true, "bar" );

	cmd.parse();
}